

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
Shell::addModule(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,WASTModule *mod)

{
  __index_type *__return_storage_ptr___00;
  __shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  type *ptVar1;
  shared_ptr<wasm::Module> *psVar2;
  element_type *peVar3;
  Err *pEVar4;
  mapped_type *this_01;
  mapped_type *this_02;
  mapped_type *this_03;
  bool bVar5;
  Ok local_1a1;
  type *local_1a0;
  type *instance;
  type *interface;
  Err local_188;
  Err *local_168;
  Err *err_2;
  Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
  _val_2;
  Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
  instanceInfo;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  shared_ptr<wasm::Module> wasm;
  Err local_a8;
  Err *local_88;
  Err *err;
  undefined1 local_70 [8];
  Result<std::shared_ptr<wasm::Module>_> _val;
  Result<std::shared_ptr<wasm::Module>_> module;
  WASTModule *mod_local;
  Shell *this_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
               super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
               super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
               super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
               super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20);
  makeModule((Result<std::shared_ptr<wasm::Module>_> *)__return_storage_ptr___00,this,mod);
  ::wasm::Result<std::shared_ptr<wasm::Module>_>::Result
            ((Result<std::shared_ptr<wasm::Module>_> *)local_70,
             (Result<std::shared_ptr<wasm::Module>_> *)__return_storage_ptr___00);
  local_88 = ::wasm::Result<std::shared_ptr<wasm::Module>_>::getErr
                       ((Result<std::shared_ptr<wasm::Module>_> *)local_70);
  bVar5 = local_88 == (Err *)0x0;
  if (!bVar5) {
    ::wasm::Err::Err(&local_a8,local_88);
    ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a8);
    ::wasm::Err::~Err(&local_a8);
  }
  ::wasm::Result<std::shared_ptr<wasm::Module>_>::~Result
            ((Result<std::shared_ptr<wasm::Module>_> *)local_70);
  if (bVar5) {
    psVar2 = ::wasm::Result<std::shared_ptr<wasm::Module>_>::operator*
                       ((Result<std::shared_ptr<wasm::Module>_> *)
                        ((long)&_val.val.
                                super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                                super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                                super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                                super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                                super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> +
                        0x20));
    this_00 = (__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    std::shared_ptr<wasm::Module>::shared_ptr((shared_ptr<wasm::Module> *)this_00,psVar2);
    peVar3 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(this_00);
    validateModule((Result<wasm::Ok> *)&err_1,this,peVar3);
    pEVar4 = ::wasm::Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    if (pEVar4 != (Err *)0x0) {
      ::wasm::Err::Err((Err *)((long)&instanceInfo.val.
                                      super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                      .
                                      super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                              + 0x20),pEVar4);
      ::wasm::Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)((long)&instanceInfo.val.
                                super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        + 0x20));
      ::wasm::Err::~Err((Err *)((long)&instanceInfo.val.
                                       super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               + 0x20));
    }
    ::wasm::Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    if (pEVar4 == (Err *)0x0) {
      peVar3 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      instantiate((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                   *)((long)&_val_2.val.
                             super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     + 0x20),this,peVar3);
      ::wasm::
      Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
      ::Result((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                *)&err_2,
               (Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                *)((long)&_val_2.val.
                          super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                  + 0x20));
      local_168 = ::wasm::
                  Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                  ::getErr((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                            *)&err_2);
      bVar5 = local_168 == (Err *)0x0;
      if (!bVar5) {
        ::wasm::Err::Err(&local_188,local_168);
        ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_188);
        ::wasm::Err::~Err(&local_188);
      }
      ::wasm::
      Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
      ::~Result((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                 *)&err_2);
      if (bVar5) {
        interface = &::wasm::
                     Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                     ::operator*((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                                  *)((long)&_val_2.val.
                                            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                            .
                                            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                                    + 0x20))->first;
        instance = (type *)std::
                           get<0ul,std::shared_ptr<wasm::ShellExternalInterface>,std::shared_ptr<wasm::ModuleRunner>>
                                     ((pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>
                                       *)interface);
        local_1a0 = std::
                    get<1ul,std::shared_ptr<wasm::ShellExternalInterface>,std::shared_ptr<wasm::ModuleRunner>>
                              ((pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>
                                *)interface);
        peVar3 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        ::wasm::Name::operator=(&this->lastModule,&peVar3->name);
        this_01 = std::
                  map<wasm::Name,_std::shared_ptr<wasm::Module>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>_>
                  ::operator[](&this->modules,&this->lastModule);
        std::shared_ptr<wasm::Module>::operator=
                  (this_01,(shared_ptr<wasm::Module> *)
                           ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        ptVar1 = instance;
        this_02 = std::
                  map<wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>_>
                  ::operator[](&this->interfaces,&this->lastModule);
        std::shared_ptr<wasm::ShellExternalInterface>::operator=
                  (this_02,(shared_ptr<wasm::ShellExternalInterface> *)ptVar1);
        ptVar1 = local_1a0;
        this_03 = std::
                  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
                  ::operator[](&this->instances,&this->lastModule);
        std::shared_ptr<wasm::ModuleRunner>::operator=(this_03,ptVar1);
        ::wasm::Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1a1);
      }
      ::wasm::
      Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
      ::~Result((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                 *)((long)&_val_2.val.
                           super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                   + 0x20));
    }
    std::shared_ptr<wasm::Module>::~shared_ptr
              ((shared_ptr<wasm::Module> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  ::wasm::Result<std::shared_ptr<wasm::Module>_>::~Result
            ((Result<std::shared_ptr<wasm::Module>_> *)
             ((long)&_val.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> addModule(WASTModule& mod) {
    auto module = makeModule(mod);
    CHECK_ERR(module);

    auto wasm = *module;
    CHECK_ERR(validateModule(*wasm));

    auto instanceInfo = instantiate(*wasm);
    CHECK_ERR(instanceInfo);

    auto& [interface, instance] = *instanceInfo;
    lastModule = wasm->name;
    modules[lastModule] = std::move(wasm);
    interfaces[lastModule] = std::move(interface);
    instances[lastModule] = std::move(instance);

    return Ok{};
  }